

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# generatecode.c
# Opt level: O2

char * cc_bits_string(int bits,char *buf)

{
  uint uVar1;
  long lVar2;
  char cVar3;
  
  uVar1 = 4;
  for (lVar2 = 0; lVar2 != 5; lVar2 = lVar2 + 1) {
    if (((uint)bits >> (uVar1 & 0x1f) & 1) == 0) {
      cVar3 = '-';
    }
    else {
      cVar3 = "-CNVXZ"[lVar2 + 1];
    }
    buf[lVar2] = cVar3;
    uVar1 = uVar1 - 1;
  }
  buf[5] = '\0';
  return buf;
}

Assistant:

static char *
cc_bits_string (int bits, char *buf)
{
  int i;

  /* Generate the string. */
  for (i = 0; i < 5; i++)
    buf[i] = (bits & (1 << (4 - i))) ? "CNVXZ"[i] : '-';
  buf[5] = '\0';

  return buf;
}